

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O3

void __thiscall
kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[230]>
          (Fault *this,char *file,int line,Type code,char *condition,char *macroArgs,
          char (*params) [230])

{
  char *pcVar1;
  size_t sVar2;
  undefined4 in_register_00000014;
  String argValues [1];
  String *__return_storage_ptr__;
  undefined8 uVar3;
  String local_68;
  char *local_48;
  String *local_40;
  undefined8 uStack_38;
  
  this->exception = (Exception *)0x0;
  __return_storage_ptr__ = &local_68;
  local_48 = macroArgs;
  str<char_const(&)[230]>
            (__return_storage_ptr__,(kj *)params,(char (*) [230])CONCAT44(in_register_00000014,line)
            );
  uStack_38 = 1;
  uVar3 = 1;
  local_40 = __return_storage_ptr__;
  init(this,(EVP_PKEY_CTX *)file);
  sVar2 = local_68.content.size_;
  pcVar1 = local_68.content.ptr;
  if (local_68.content.ptr != (char *)0x0) {
    local_68.content.ptr = (char *)0x0;
    local_68.content.size_ = 0;
    (*(code *)**(undefined8 **)local_68.content.disposer)
              (local_68.content.disposer,pcVar1,1,sVar2,sVar2,0,__return_storage_ptr__,uVar3);
  }
  return;
}

Assistant:

Debug::Fault::Fault(const char* file, int line, Code code,
                    const char* condition, const char* macroArgs, Params&&... params)
    : exception(nullptr) {
  String argValues[sizeof...(Params)] = {str(params)...};
  init(file, line, code, condition, macroArgs,
       arrayPtr(argValues, sizeof...(Params)));
}